

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

void __thiscall Assimp::Importer::Importer(Importer *this)

{
  _Rb_tree_header *p_Var1;
  ImporterPimpl *pIVar2;
  IOSystem *pIVar3;
  ProgressHandler *pPVar4;
  SharedPostProcessInfo *pSVar5;
  pointer ppBVar6;
  
  pIVar2 = (ImporterPimpl *)operator_new(0x148);
  ImporterPimpl::ImporterPimpl(pIVar2);
  this->pimpl = pIVar2;
  pIVar2->mScene = (aiScene *)0x0;
  std::__cxx11::string::assign((char *)&pIVar2->mErrorString);
  pIVar3 = (IOSystem *)operator_new(0x20);
  (pIVar3->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar3->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar3->m_pathStack).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pIVar3->_vptr_IOSystem = (_func_int **)&PTR__IOSystem_007312d0;
  this->pimpl->mIOHandler = pIVar3;
  this->pimpl->mIsDefaultHandler = true;
  this->pimpl->bExtraVerbose = false;
  pPVar4 = (ProgressHandler *)operator_new(8);
  pPVar4->_vptr_ProgressHandler = (_func_int **)&PTR__ProgressHandler_0072f4b8;
  this->pimpl->mProgressHandler = pPVar4;
  this->pimpl->mIsDefaultProgressHandler = true;
  GetImporterInstanceList(&this->pimpl->mImporter);
  GetPostProcessingStepInstanceList(&this->pimpl->mPostProcessingSteps);
  pSVar5 = (SharedPostProcessInfo *)operator_new(0x30);
  p_Var1 = &(pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header;
  (pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pSVar5->pmap)._M_t._M_impl = 0;
  *(undefined8 *)&(pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pSVar5->pmap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->pimpl->mPPShared = pSVar5;
  pIVar2 = this->pimpl;
  for (ppBVar6 = (pIVar2->mPostProcessingSteps).
                 super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppBVar6 !=
      (pIVar2->mPostProcessingSteps).
      super__Vector_base<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppBVar6 = ppBVar6 + 1) {
    (*ppBVar6)->shared = pIVar2->mPPShared;
    pIVar2 = this->pimpl;
  }
  return;
}

Assistant:

Importer::Importer()
 : pimpl( new ImporterPimpl ) {
    pimpl->mScene = NULL;
    pimpl->mErrorString = "";

    // Allocate a default IO handler
    pimpl->mIOHandler = new DefaultIOSystem;
    pimpl->mIsDefaultHandler = true;
    pimpl->bExtraVerbose     = false; // disable extra verbose mode by default

    pimpl->mProgressHandler = new DefaultProgressHandler();
    pimpl->mIsDefaultProgressHandler = true;

    GetImporterInstanceList(pimpl->mImporter);
    GetPostProcessingStepInstanceList(pimpl->mPostProcessingSteps);

    // Allocate a SharedPostProcessInfo object and store pointers to it in all post-process steps in the list.
    pimpl->mPPShared = new SharedPostProcessInfo();
    for (std::vector<BaseProcess*>::iterator it =  pimpl->mPostProcessingSteps.begin();
        it != pimpl->mPostProcessingSteps.end();
        ++it)   {

        (*it)->SetSharedData(pimpl->mPPShared);
    }
}